

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O3

void __thiscall
VectorFormatter<DefaultFormatter>::
Ser<VectorWriter,std::vector<CBlockHeader,std::allocator<CBlockHeader>>>
          (VectorFormatter<DefaultFormatter> *this,VectorWriter *s,
          vector<CBlockHeader,_std::allocator<CBlockHeader>_> *v)

{
  long lVar1;
  pointer pCVar2;
  value_type *elem;
  pointer args;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  WriteCompactSize<VectorWriter>
            (s,((long)(v->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(v->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
                      super__Vector_impl_data._M_start >> 4) * -0x3333333333333333);
  pCVar2 = (v->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (args = (v->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
              super__Vector_impl_data._M_start; args != pCVar2; args = args + 1) {
    SerializeMany<VectorWriter,int,uint256,uint256,unsigned_int,unsigned_int,unsigned_int>
              (s,&args->nVersion,&args->hashPrevBlock,&args->hashMerkleRoot,&args->nTime,
               &args->nBits,&args->nNonce);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Ser(Stream& s, const V& v)
    {
        Formatter formatter;
        WriteCompactSize(s, v.size());
        for (const typename V::value_type& elem : v) {
            formatter.Ser(s, elem);
        }
    }